

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

bool __thiscall entityx::EntityManager::has_component<A>(EntityManager *this,Id id)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  const_reference ppBVar4;
  EntityManager *this_00;
  int __c;
  Id in_RSI;
  EntityManager *in_RDI;
  BasePool *pool;
  size_t family;
  Id local_10 [2];
  
  assert_valid(in_RDI,in_RSI);
  pcVar2 = (char *)component_family<A>();
  pcVar3 = (char *)Catch::clara::std::
                   vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::size
                             ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                              (in_RDI + 0x18));
  if ((pcVar2 < pcVar3) &&
     (ppBVar4 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>
                ::operator[]((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                             (in_RDI + 0x18),(size_type)pcVar2), *ppBVar4 != (value_type)0x0)) {
    this_00 = in_RDI + 0x48;
    pcVar2 = Entity::Id::index(local_10,pcVar2,__c);
    Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
              ((vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)this_00,
               (ulong)pcVar2 & 0xffffffff);
    bVar1 = Catch::clara::std::bitset<64UL>::operator[]((bitset<64UL> *)in_RDI,(size_t)this_00);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool has_component(Entity::Id id) const {
    assert_valid(id);
    size_t family = component_family<C>();
    // We don't bother checking the component mask, as we return a nullptr anyway.
    if (family >= component_pools_.size())
      return false;
    BasePool *pool = component_pools_[family];
    if (!pool || !entity_component_mask_[id.index()][family])
      return false;
    return true;
  }